

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_crc.cc
# Opt level: O0

CordRepCrc * absl::lts_20250127::cord_internal::CordRepCrc::New(CordRep *child,CrcCordState *state)

{
  bool bVar1;
  CordRepCrc *pCVar2;
  RefcountedRep *local_58;
  CordRepCrc *new_cordrep;
  CordRep *old;
  CrcCordState *state_local;
  CordRep *child_local;
  
  state_local = (CrcCordState *)child;
  if ((child != (CordRep *)0x0) && (bVar1 = CordRep::IsCrc(child), bVar1)) {
    bVar1 = RefcountAndFlags::IsOne(&child->refcount);
    if (bVar1) {
      pCVar2 = CordRep::crc(child);
      crc_internal::CrcCordState::operator=(&pCVar2->crc_cord_state,state);
      pCVar2 = CordRep::crc(child);
      return pCVar2;
    }
    pCVar2 = CordRep::crc(child);
    state_local = (CrcCordState *)pCVar2->child;
    CordRep::Ref((CordRep *)state_local);
    CordRep::Unref(child);
  }
  pCVar2 = (CordRepCrc *)operator_new(0x20);
  CordRepCrc(pCVar2);
  if (state_local == (CrcCordState *)0x0) {
    local_58 = (RefcountedRep *)0x0;
  }
  else {
    local_58 = state_local->refcounted_rep_;
  }
  (pCVar2->super_CordRep).length = (size_t)local_58;
  (pCVar2->super_CordRep).tag = '\x02';
  pCVar2->child = (CordRep *)state_local;
  crc_internal::CrcCordState::operator=(&pCVar2->crc_cord_state,state);
  return pCVar2;
}

Assistant:

CordRepCrc* CordRepCrc::New(CordRep* child, crc_internal::CrcCordState state) {
  if (child != nullptr && child->IsCrc()) {
    if (child->refcount.IsOne()) {
      child->crc()->crc_cord_state = std::move(state);
      return child->crc();
    }
    CordRep* old = child;
    child = old->crc()->child;
    CordRep::Ref(child);
    CordRep::Unref(old);
  }
  auto* new_cordrep = new CordRepCrc;
  new_cordrep->length = child != nullptr ? child->length : 0;
  new_cordrep->tag = cord_internal::CRC;
  new_cordrep->child = child;
  new_cordrep->crc_cord_state = std::move(state);
  return new_cordrep;
}